

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O2

HighsInt Highs_getModel(void *highs,HighsInt a_format,HighsInt q_format,HighsInt *num_col,
                       HighsInt *num_row,HighsInt *num_nz,HighsInt *q_num_nz,HighsInt *sense,
                       double *offset,double *col_cost,double *col_lower,double *col_upper,
                       double *row_lower,double *row_upper,HighsInt *a_start,HighsInt *a_index,
                       double *a_value,HighsInt *q_start,HighsInt *q_index,double *q_value,
                       HighsInt *integrality)

{
  void *__src;
  
  Highs_getHighsLpData
            ((HighsLp *)((long)highs + 0x138),a_format,num_col,num_row,num_nz,sense,offset,col_cost,
             col_lower,col_upper,row_lower,row_upper,a_start,a_index,a_value,integrality);
  if (0 < *(int *)((long)highs + 0x4d0)) {
    __src = *(void **)((long)highs + 0x4d8);
    *q_num_nz = *(HighsInt *)((long)__src + (long)*num_col * 4);
    if (q_start != (HighsInt *)0x0) {
      memcpy(q_start,__src,(long)*num_col << 2);
    }
    if (q_index != (HighsInt *)0x0) {
      memcpy(q_index,*(void **)((long)highs + 0x4f0),(long)*q_num_nz << 2);
    }
    if (q_value != (double *)0x0) {
      memcpy(q_value,*(void **)((long)highs + 0x508),(long)*q_num_nz << 3);
    }
  }
  return 0;
}

Assistant:

HighsInt Highs_getModel(const void* highs, const HighsInt a_format,
                        const HighsInt q_format, HighsInt* num_col,
                        HighsInt* num_row, HighsInt* num_nz, HighsInt* q_num_nz,
                        HighsInt* sense, double* offset, double* col_cost,
                        double* col_lower, double* col_upper, double* row_lower,
                        double* row_upper, HighsInt* a_start, HighsInt* a_index,
                        double* a_value, HighsInt* q_start, HighsInt* q_index,
                        double* q_value, HighsInt* integrality) {
  HighsInt return_status = Highs_getHighsLpData(
      ((Highs*)highs)->getLp(), a_format, num_col, num_row, num_nz, sense,
      offset, col_cost, col_lower, col_upper, row_lower, row_upper, a_start,
      a_index, a_value, integrality);
  if (return_status != kHighsStatusOk) return return_status;
  const HighsHessian& hessian = ((Highs*)highs)->getModel().hessian_;
  if (hessian.dim_ > 0) {
    *q_num_nz = hessian.start_[*num_col];
    if (q_start)
      memcpy(q_start, hessian.start_.data(), *num_col * sizeof(HighsInt));
    if (q_index)
      memcpy(q_index, hessian.index_.data(), *q_num_nz * sizeof(HighsInt));
    if (q_value)
      memcpy(q_value, hessian.value_.data(), *q_num_nz * sizeof(double));
  }
  return kHighsStatusOk;
}